

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O2

void ncnn::pack_A_tile_fp32_to_int8_avx2
               (Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk,Mat *scales)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  void *pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  size_t *psVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  float *pfVar20;
  int kk_3;
  undefined1 (*pauVar21) [32];
  long lVar22;
  long lVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [16];
  long lVar26;
  long lVar27;
  int kk_2;
  int iVar28;
  long lVar29;
  undefined1 (*pauVar30) [16];
  int kk;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  __m128i _vindex;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  float fVar66;
  float fVar86;
  undefined1 auVar76 [32];
  undefined1 auVar68 [16];
  undefined1 auVar78 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar84;
  float fVar85;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 in_ZMM9 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar92 [32];
  float fVar99;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar90;
  undefined1 auVar95 [32];
  undefined1 auVar91 [16];
  float fVar97;
  float fVar98;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 in_ZMM10 [64];
  undefined1 auVar96 [64];
  undefined1 auVar103 [32];
  undefined1 auVar58 [64];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  
  iVar15 = cpu_support_x86_avx_vnni_int8();
  if (iVar15 != 0) {
    pack_A_tile_fp32_to_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk,scales);
    return;
  }
  iVar15 = cpu_support_x86_avx_vnni();
  auVar37 = _DAT_005443f0;
  if (iVar15 == 0) {
    iVar15 = A->elempack;
    psVar16 = (size_t *)&A->w;
    if (A->dims == 3) {
      psVar16 = &A->cstep;
    }
    iVar28 = (int)*psVar16;
    lVar33 = (long)iVar28;
    pauVar25 = (undefined1 (*) [16])AT->data;
    lVar32 = (long)(iVar15 * k);
    lVar29 = (long)i;
    lVar22 = (long)(iVar28 * 4);
    auVar103._4_4_ = iVar28;
    auVar103._0_4_ = iVar28;
    auVar103._8_4_ = iVar28;
    auVar103._12_4_ = iVar28;
    auVar103._16_4_ = iVar28;
    auVar103._20_4_ = iVar28;
    auVar103._24_4_ = iVar28;
    auVar103._28_4_ = iVar28;
    vpmulld_avx2(auVar103,_DAT_0053ab40);
    lVar17 = (long)max_ii;
    lVar26 = (long)k;
    lVar23 = lVar26 * 4 + lVar33 * lVar29 * 4;
    lVar18 = lVar33 * 0x20;
    lVar27 = (lVar29 * 4 + 4) * lVar33 + lVar26 * 4;
    lVar34 = lVar32 * 4 + lVar33 * lVar29 * 4;
    auVar40._8_4_ = 0x80000000;
    auVar40._0_8_ = 0x8000000080000000;
    auVar40._12_4_ = 0x80000000;
    auVar40._16_4_ = 0x80000000;
    auVar40._20_4_ = 0x80000000;
    auVar40._24_4_ = 0x80000000;
    auVar40._28_4_ = 0x80000000;
    auVar43._8_4_ = 0x3f000000;
    auVar43._0_8_ = 0x3f0000003f000000;
    auVar43._12_4_ = 0x3f000000;
    auVar43._16_4_ = 0x3f000000;
    auVar43._20_4_ = 0x3f000000;
    auVar43._24_4_ = 0x3f000000;
    auVar43._28_4_ = 0x3f000000;
    auVar45._8_2_ = 0x7f;
    auVar45._0_8_ = 0x7f007f007f007f;
    auVar45._10_2_ = 0x7f;
    auVar45._12_2_ = 0x7f;
    auVar45._14_2_ = 0x7f;
    auVar45._16_2_ = 0x7f;
    auVar45._18_2_ = 0x7f;
    auVar45._20_2_ = 0x7f;
    auVar45._22_2_ = 0x7f;
    auVar45._24_2_ = 0x7f;
    auVar45._26_2_ = 0x7f;
    auVar45._28_2_ = 0x7f;
    auVar45._30_2_ = 0x7f;
    auVar57._8_2_ = 0xff81;
    auVar57._0_8_ = 0xff81ff81ff81ff81;
    auVar57._10_2_ = 0xff81;
    auVar57._12_2_ = 0xff81;
    auVar57._14_2_ = 0xff81;
    auVar57._16_2_ = 0xff81;
    auVar57._18_2_ = 0xff81;
    auVar57._20_2_ = 0xff81;
    auVar57._22_2_ = 0xff81;
    auVar57._24_2_ = 0xff81;
    auVar57._26_2_ = 0xff81;
    auVar57._28_2_ = 0xff81;
    auVar57._30_2_ = 0xff81;
    auVar58 = ZEXT3264(auVar57);
    auVar35._8_2_ = 0x7f;
    auVar35._0_8_ = 0x7f007f007f007f;
    auVar35._10_2_ = 0x7f;
    auVar35._12_2_ = 0x7f;
    auVar35._14_2_ = 0x7f;
    auVar36._8_2_ = 0xff81;
    auVar36._0_8_ = 0xff81ff81ff81ff81;
    auVar36._10_2_ = 0xff81;
    auVar36._12_2_ = 0xff81;
    auVar36._14_2_ = 0xff81;
    for (uVar24 = 0; pvVar4 = A->data, (long)(uVar24 | 7) < lVar17; uVar24 = uVar24 + 8) {
      pauVar21 = (undefined1 (*) [32])((long)pvVar4 + lVar32 * 4 + (lVar29 + uVar24) * lVar33 * 4);
      auVar103 = *(undefined1 (*) [32])((long)scales->data + uVar24 * 4 + lVar29 * 4);
      fVar2 = auVar103._0_4_;
      fVar3 = auVar103._4_4_;
      fVar10 = auVar103._8_4_;
      fVar6 = auVar103._12_4_;
      fVar7 = auVar103._16_4_;
      fVar8 = auVar103._20_4_;
      fVar9 = auVar103._24_4_;
      if (iVar15 == 8) {
        lVar19 = 0;
        for (iVar31 = 0; iVar31 + 1 < max_kk; iVar31 = iVar31 + 2) {
          pfVar20 = (float *)((long)pvVar4 + lVar19 * 4 + lVar34);
          auVar80._0_4_ = fVar2 * *pfVar20;
          auVar80._4_4_ = fVar3 * pfVar20[1];
          auVar80._8_4_ = fVar10 * pfVar20[2];
          auVar80._12_4_ = fVar6 * pfVar20[3];
          auVar80._16_4_ = fVar7 * pfVar20[4];
          auVar80._20_4_ = fVar8 * pfVar20[5];
          auVar80._28_36_ = in_ZMM9._28_36_;
          auVar80._24_4_ = fVar9 * pfVar20[6];
          pfVar20 = (float *)((long)pvVar4 + lVar19 * 4 + lVar34 + 0x20);
          auVar96._0_4_ = fVar2 * *pfVar20;
          auVar96._4_4_ = fVar3 * pfVar20[1];
          auVar96._8_4_ = fVar10 * pfVar20[2];
          auVar96._12_4_ = fVar6 * pfVar20[3];
          auVar96._16_4_ = fVar7 * pfVar20[4];
          auVar96._20_4_ = fVar8 * pfVar20[5];
          auVar96._28_36_ = in_ZMM10._28_36_;
          auVar96._24_4_ = fVar9 * pfVar20[6];
          auVar103 = vandps_avx(auVar80._0_32_,auVar40);
          auVar75 = vandps_avx(auVar96._0_32_,auVar40);
          auVar103 = vorps_avx(auVar103,auVar43);
          auVar75 = vorps_avx(auVar75,auVar43);
          auVar94._0_4_ = (int)(auVar80._0_4_ + auVar103._0_4_);
          auVar94._4_4_ = (int)(auVar80._4_4_ + auVar103._4_4_);
          auVar94._8_4_ = (int)(auVar80._8_4_ + auVar103._8_4_);
          auVar94._12_4_ = (int)(auVar80._12_4_ + auVar103._12_4_);
          auVar94._16_4_ = (int)(auVar80._16_4_ + auVar103._16_4_);
          auVar94._20_4_ = (int)(auVar80._20_4_ + auVar103._20_4_);
          auVar94._24_4_ = (int)(auVar80._24_4_ + auVar103._24_4_);
          auVar94._28_4_ = (int)(in_ZMM9._28_4_ + auVar103._28_4_);
          auVar92._0_4_ = (int)(auVar96._0_4_ + auVar75._0_4_);
          auVar92._4_4_ = (int)(auVar96._4_4_ + auVar75._4_4_);
          auVar92._8_4_ = (int)(auVar96._8_4_ + auVar75._8_4_);
          auVar92._12_4_ = (int)(auVar96._12_4_ + auVar75._12_4_);
          auVar92._16_4_ = (int)(auVar96._16_4_ + auVar75._16_4_);
          auVar92._20_4_ = (int)(auVar96._20_4_ + auVar75._20_4_);
          auVar92._24_4_ = (int)(auVar96._24_4_ + auVar75._24_4_);
          auVar92._28_4_ = (int)(in_ZMM10._28_4_ + auVar75._28_4_);
          auVar103 = vpackssdw_avx2(auVar94,auVar92);
          auVar103 = vpermq_avx2(auVar103,0xd8);
          auVar103 = vpminsw_avx2(auVar103,auVar45);
          auVar103 = vpmaxsw_avx2(auVar103,auVar57);
          in_ZMM10 = ZEXT1664(auVar103._16_16_);
          auVar67 = vpacksswb_avx(auVar103._0_16_,auVar103._16_16_);
          auVar67 = vpshufb_avx(auVar67,auVar37);
          in_ZMM9 = ZEXT1664(auVar67);
          *(undefined1 (*) [16])(*pauVar25 + lVar19) = auVar67;
          pauVar21 = pauVar21 + 2;
          lVar19 = lVar19 + 0x10;
        }
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar19);
        for (; iVar31 < max_kk; iVar31 = iVar31 + 1) {
          auVar81._0_4_ = fVar2 * *(float *)*pauVar21;
          auVar81._4_4_ = fVar3 * *(float *)(*pauVar21 + 4);
          auVar81._8_4_ = fVar10 * *(float *)(*pauVar21 + 8);
          auVar81._12_4_ = fVar6 * *(float *)(*pauVar21 + 0xc);
          auVar81._16_4_ = fVar7 * *(float *)(*pauVar21 + 0x10);
          auVar81._20_4_ = fVar8 * *(float *)(*pauVar21 + 0x14);
          auVar81._28_36_ = in_ZMM9._28_36_;
          auVar81._24_4_ = fVar9 * *(float *)(*pauVar21 + 0x18);
          auVar103 = vandps_avx(auVar81._0_32_,auVar40);
          auVar103 = vorps_avx(auVar103,auVar43);
          auVar67._0_4_ = (int)(auVar81._0_4_ + auVar103._0_4_);
          auVar67._4_4_ = (int)(auVar81._4_4_ + auVar103._4_4_);
          auVar67._8_4_ = (int)(auVar81._8_4_ + auVar103._8_4_);
          auVar67._12_4_ = (int)(auVar81._12_4_ + auVar103._12_4_);
          auVar75._16_4_ = (int)(auVar81._16_4_ + auVar103._16_4_);
          auVar75._0_16_ = auVar67;
          auVar75._20_4_ = (int)(auVar81._20_4_ + auVar103._20_4_);
          auVar75._24_4_ = (int)(auVar81._24_4_ + auVar103._24_4_);
          auVar75._28_4_ = (int)(in_ZMM9._28_4_ + auVar103._28_4_);
          in_ZMM10 = ZEXT1664(auVar75._16_16_);
          auVar67 = vpackssdw_avx(auVar67,auVar75._16_16_);
          auVar67 = vpminsw_avx(auVar67,auVar35);
          auVar67 = vpmaxsw_avx(auVar67,auVar36);
          auVar67 = vpacksswb_avx(auVar67,auVar67);
          in_ZMM9 = ZEXT1664(auVar67);
          *(long *)*pauVar25 = auVar67._0_8_;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + 8);
          pauVar21 = pauVar21 + 1;
        }
      }
      if (iVar15 == 4) {
        for (iVar31 = 0; iVar31 + 1 < max_kk; iVar31 = iVar31 + 2) {
          auVar103 = *(undefined1 (*) [32])(*pauVar21 + lVar22 * 4);
          auVar75 = vperm2f128_avx(*pauVar21,auVar103,0x20);
          auVar92 = vperm2f128_avx(*pauVar21,auVar103,0x31);
          fVar90 = auVar75._0_4_ * fVar2;
          fVar97 = auVar75._4_4_ * fVar3;
          auVar11._4_4_ = fVar97;
          auVar11._0_4_ = fVar90;
          fVar98 = auVar75._8_4_ * fVar10;
          auVar11._8_4_ = fVar98;
          fVar99 = auVar75._12_4_ * fVar6;
          auVar11._12_4_ = fVar99;
          fVar100 = auVar75._16_4_ * fVar7;
          auVar11._16_4_ = fVar100;
          fVar101 = auVar75._20_4_ * fVar8;
          auVar11._20_4_ = fVar101;
          fVar102 = auVar75._24_4_ * fVar9;
          auVar11._24_4_ = fVar102;
          auVar11._28_4_ = auVar103._28_4_;
          fVar66 = auVar92._0_4_ * fVar2;
          fVar84 = auVar92._4_4_ * fVar3;
          auVar12._4_4_ = fVar84;
          auVar12._0_4_ = fVar66;
          fVar85 = auVar92._8_4_ * fVar10;
          auVar12._8_4_ = fVar85;
          fVar86 = auVar92._12_4_ * fVar6;
          auVar12._12_4_ = fVar86;
          fVar87 = auVar92._16_4_ * fVar7;
          auVar12._16_4_ = fVar87;
          fVar88 = auVar92._20_4_ * fVar8;
          auVar12._20_4_ = fVar88;
          fVar89 = auVar92._24_4_ * fVar9;
          auVar12._24_4_ = fVar89;
          auVar12._28_4_ = auVar92._28_4_;
          auVar75 = vandps_avx(auVar11,auVar40);
          auVar94 = vandps_avx(auVar12,auVar40);
          auVar75 = vorps_avx(auVar75,auVar43);
          auVar94 = vorps_avx(auVar94,auVar43);
          auVar93._0_4_ = (int)(fVar90 + auVar75._0_4_);
          auVar93._4_4_ = (int)(fVar97 + auVar75._4_4_);
          auVar93._8_4_ = (int)(fVar98 + auVar75._8_4_);
          auVar93._12_4_ = (int)(fVar99 + auVar75._12_4_);
          auVar93._16_4_ = (int)(fVar100 + auVar75._16_4_);
          auVar93._20_4_ = (int)(fVar101 + auVar75._20_4_);
          auVar93._24_4_ = (int)(fVar102 + auVar75._24_4_);
          auVar93._28_4_ = (int)(auVar103._28_4_ + auVar75._28_4_);
          auVar76._0_4_ = (int)(fVar66 + auVar94._0_4_);
          auVar76._4_4_ = (int)(fVar84 + auVar94._4_4_);
          auVar76._8_4_ = (int)(fVar85 + auVar94._8_4_);
          auVar76._12_4_ = (int)(fVar86 + auVar94._12_4_);
          auVar76._16_4_ = (int)(fVar87 + auVar94._16_4_);
          auVar76._20_4_ = (int)(fVar88 + auVar94._20_4_);
          auVar76._24_4_ = (int)(fVar89 + auVar94._24_4_);
          auVar76._28_4_ = (int)(auVar92._28_4_ + auVar94._28_4_);
          auVar103 = vpackssdw_avx2(auVar93,auVar76);
          auVar103 = vpermq_avx2(auVar103,0xd8);
          auVar103 = vpminsw_avx2(auVar103,auVar45);
          auVar103 = vpmaxsw_avx2(auVar103,auVar57);
          in_ZMM10 = ZEXT1664(auVar103._16_16_);
          auVar67 = vpacksswb_avx(auVar103._0_16_,auVar103._16_16_);
          auVar67 = vpshufb_avx(auVar67,auVar37);
          in_ZMM9 = ZEXT1664(auVar67);
          *pauVar25 = auVar67;
          pauVar25 = pauVar25 + 1;
          pauVar21 = pauVar21 + 1;
        }
        for (; iVar31 < max_kk; iVar31 = iVar31 + 1) {
          fVar66 = *(float *)*pauVar21 * fVar2;
          fVar84 = *(float *)(*pauVar21 + 4) * fVar3;
          auVar13._4_4_ = fVar84;
          auVar13._0_4_ = fVar66;
          fVar85 = *(float *)(*pauVar21 + 8) * fVar10;
          auVar13._8_4_ = fVar85;
          fVar86 = *(float *)(*pauVar21 + 0xc) * fVar6;
          auVar13._12_4_ = fVar86;
          fVar87 = *(float *)(*pauVar21 + lVar22 * 4 + 0x10) * fVar7;
          auVar13._16_4_ = fVar87;
          fVar88 = *(float *)(*pauVar21 + lVar22 * 4 + 0x14) * fVar8;
          auVar13._20_4_ = fVar88;
          fVar89 = *(float *)(*pauVar21 + lVar22 * 4 + 0x18) * fVar9;
          auVar13._24_4_ = fVar89;
          auVar13._28_4_ = *(float *)(*pauVar21 + lVar22 * 4 + 0x1c);
          auVar103 = vandps_avx(auVar13,auVar40);
          auVar103 = vorps_avx(auVar103,auVar43);
          auVar68._0_4_ = (int)(fVar66 + auVar103._0_4_);
          auVar68._4_4_ = (int)(fVar84 + auVar103._4_4_);
          auVar68._8_4_ = (int)(fVar85 + auVar103._8_4_);
          auVar68._12_4_ = (int)(fVar86 + auVar103._12_4_);
          auVar77._16_4_ = (int)(fVar87 + auVar103._16_4_);
          auVar77._0_16_ = auVar68;
          auVar77._20_4_ = (int)(fVar88 + auVar103._20_4_);
          auVar77._24_4_ = (int)(fVar89 + auVar103._24_4_);
          auVar77._28_4_ = (int)(*(float *)(*pauVar21 + lVar22 * 4 + 0x1c) + auVar103._28_4_);
          in_ZMM10 = ZEXT1664(auVar77._16_16_);
          auVar67 = vpackssdw_avx(auVar68,auVar77._16_16_);
          auVar67 = vpminsw_avx(auVar67,auVar35);
          auVar67 = vpmaxsw_avx(auVar67,auVar36);
          auVar67 = vpacksswb_avx(auVar67,auVar67);
          in_ZMM9 = ZEXT1664(auVar67);
          *(long *)*pauVar25 = auVar67._0_8_;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + 8);
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
        }
      }
      if (iVar15 == 1) {
        for (iVar31 = 0; iVar31 + 1 < max_kk; iVar31 = iVar31 + 2) {
          auVar103 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
          auVar94 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar103);
          auVar103 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
          auVar103 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar103);
          auVar82._0_4_ = auVar94._0_4_ * fVar2;
          auVar82._4_4_ = auVar94._4_4_ * fVar3;
          auVar82._8_4_ = auVar94._8_4_ * fVar10;
          auVar82._12_4_ = auVar94._12_4_ * fVar6;
          auVar82._16_4_ = auVar94._16_4_ * fVar7;
          auVar82._20_4_ = auVar94._20_4_ * fVar8;
          auVar82._28_36_ = SUB6436(ZEXT3264((undefined1  [32])0x0),0x1c);
          auVar82._24_4_ = auVar94._24_4_ * fVar9;
          fVar66 = auVar103._0_4_ * fVar2;
          fVar84 = auVar103._4_4_ * fVar3;
          auVar14._4_4_ = fVar84;
          auVar14._0_4_ = fVar66;
          fVar85 = auVar103._8_4_ * fVar10;
          auVar14._8_4_ = fVar85;
          fVar86 = auVar103._12_4_ * fVar6;
          auVar14._12_4_ = fVar86;
          fVar87 = auVar103._16_4_ * fVar7;
          auVar14._16_4_ = fVar87;
          fVar88 = auVar103._20_4_ * fVar8;
          auVar14._20_4_ = fVar88;
          fVar89 = auVar103._24_4_ * fVar9;
          auVar14._24_4_ = fVar89;
          auVar14._28_4_ = auVar94._28_4_;
          auVar103 = vandps_avx(auVar82._0_32_,auVar40);
          auVar75 = vandps_avx(auVar14,auVar40);
          auVar103 = vorps_avx(auVar103,auVar43);
          auVar75 = vorps_avx(auVar75,auVar43);
          auVar78._0_4_ = (int)(auVar82._0_4_ + auVar103._0_4_);
          auVar78._4_4_ = (int)(auVar82._4_4_ + auVar103._4_4_);
          auVar78._8_4_ = (int)(auVar82._8_4_ + auVar103._8_4_);
          auVar78._12_4_ = (int)(auVar82._12_4_ + auVar103._12_4_);
          auVar78._16_4_ = (int)(auVar82._16_4_ + auVar103._16_4_);
          auVar78._20_4_ = (int)(auVar82._20_4_ + auVar103._20_4_);
          auVar78._24_4_ = (int)(auVar82._24_4_ + auVar103._24_4_);
          auVar78._28_4_ = (int)(SUB644(ZEXT3264((undefined1  [32])0x0),0x1c) + auVar103._28_4_);
          auVar95._0_4_ = (int)(fVar66 + auVar75._0_4_);
          auVar95._4_4_ = (int)(fVar84 + auVar75._4_4_);
          auVar95._8_4_ = (int)(fVar85 + auVar75._8_4_);
          auVar95._12_4_ = (int)(fVar86 + auVar75._12_4_);
          auVar95._16_4_ = (int)(fVar87 + auVar75._16_4_);
          auVar95._20_4_ = (int)(fVar88 + auVar75._20_4_);
          auVar95._24_4_ = (int)(fVar89 + auVar75._24_4_);
          auVar95._28_4_ = (int)(auVar94._28_4_ + auVar75._28_4_);
          auVar103 = vpackssdw_avx2(auVar78,auVar95);
          auVar103 = vpermq_avx2(auVar103,0xd8);
          auVar103 = vpminsw_avx2(auVar103,auVar45);
          auVar103 = vpmaxsw_avx2(auVar103,auVar57);
          in_ZMM10 = ZEXT1664(auVar103._16_16_);
          auVar67 = vpacksswb_avx(auVar103._0_16_,auVar103._16_16_);
          auVar67 = vpshufb_avx(auVar67,auVar37);
          in_ZMM9 = ZEXT1664(auVar67);
          *pauVar25 = auVar67;
          pauVar25 = pauVar25 + 1;
        }
        for (; iVar31 < max_kk; iVar31 = iVar31 + 1) {
          auVar103 = vpcmpeqd_avx2(in_ZMM9._0_32_,in_ZMM9._0_32_);
          auVar103 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar103);
          auVar83._0_4_ = auVar103._0_4_ * fVar2;
          auVar83._4_4_ = auVar103._4_4_ * fVar3;
          auVar83._8_4_ = auVar103._8_4_ * fVar10;
          auVar83._12_4_ = auVar103._12_4_ * fVar6;
          auVar83._16_4_ = auVar103._16_4_ * fVar7;
          auVar83._20_4_ = auVar103._20_4_ * fVar8;
          auVar83._28_36_ = SUB6436(ZEXT3264((undefined1  [32])0x0),0x1c);
          auVar83._24_4_ = auVar103._24_4_ * fVar9;
          auVar103 = vandps_avx(auVar83._0_32_,auVar40);
          auVar103 = vorps_avx(auVar103,auVar43);
          auVar69._0_4_ = (int)(auVar83._0_4_ + auVar103._0_4_);
          auVar69._4_4_ = (int)(auVar83._4_4_ + auVar103._4_4_);
          auVar69._8_4_ = (int)(auVar83._8_4_ + auVar103._8_4_);
          auVar69._12_4_ = (int)(auVar83._12_4_ + auVar103._12_4_);
          auVar79._16_4_ = (int)(auVar83._16_4_ + auVar103._16_4_);
          auVar79._0_16_ = auVar69;
          auVar79._20_4_ = (int)(auVar83._20_4_ + auVar103._20_4_);
          auVar79._24_4_ = (int)(auVar83._24_4_ + auVar103._24_4_);
          auVar79._28_4_ = (int)(SUB644(ZEXT3264((undefined1  [32])0x0),0x1c) + auVar103._28_4_);
          in_ZMM10 = ZEXT1664(auVar79._16_16_);
          auVar67 = vpackssdw_avx(auVar69,auVar79._16_16_);
          auVar67 = vpminsw_avx(auVar67,auVar35);
          auVar67 = vpmaxsw_avx(auVar67,auVar36);
          auVar67 = vpacksswb_avx(auVar67,auVar67);
          in_ZMM9 = ZEXT1664(auVar67);
          *(long *)*pauVar25 = auVar67._0_8_;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + 8);
        }
      }
      lVar23 = lVar23 + lVar18;
      lVar27 = lVar27 + lVar18;
      lVar34 = lVar34 + lVar18;
    }
    pvVar5 = scales->data;
    auVar37._4_4_ = iVar28;
    auVar37._0_4_ = iVar28;
    auVar37._8_4_ = iVar28;
    auVar37._12_4_ = iVar28;
    vpmulld_avx(auVar37,_DAT_00539810);
    lVar18 = lVar33 * 0x10;
    lVar34 = lVar34 + (long)pvVar4;
    auVar38._8_4_ = 0x80000000;
    auVar38._0_8_ = 0x8000000080000000;
    auVar38._12_4_ = 0x80000000;
    auVar39._8_4_ = 0x3f000000;
    auVar39._0_8_ = 0x3f0000003f000000;
    auVar39._12_4_ = 0x3f000000;
    for (; (long)(uVar24 | 3) < lVar17; uVar24 = uVar24 + 4) {
      pfVar20 = (float *)((long)pvVar4 + (lVar29 + uVar24) * lVar33 * 4 + lVar32 * 4);
      pfVar1 = (float *)((long)pvVar5 + uVar24 * 4 + lVar29 * 4);
      fVar2 = *pfVar1;
      fVar3 = pfVar1[1];
      fVar10 = pfVar1[2];
      fVar6 = pfVar1[3];
      if (iVar15 == 4) {
        lVar22 = 0;
        for (iVar28 = 0; iVar28 + 1 < max_kk; iVar28 = iVar28 + 2) {
          pfVar1 = (float *)(lVar34 + lVar22 * 4);
          auVar46._0_4_ = fVar2 * *pfVar1;
          auVar46._4_4_ = fVar3 * pfVar1[1];
          auVar46._8_4_ = fVar10 * pfVar1[2];
          auVar46._12_4_ = fVar6 * pfVar1[3];
          pfVar1 = (float *)(lVar34 + 0x10 + lVar22 * 4);
          auVar59._0_4_ = fVar2 * *pfVar1;
          auVar59._4_4_ = fVar3 * pfVar1[1];
          auVar59._8_4_ = fVar10 * pfVar1[2];
          auVar59._12_4_ = fVar6 * pfVar1[3];
          auVar69 = vunpcklps_avx(auVar46,auVar59);
          auVar68 = vunpckhps_avx(auVar46,auVar59);
          auVar37 = vandps_avx(auVar69,auVar38);
          auVar67 = vandps_avx(auVar68,auVar38);
          auVar37 = vorps_avx(auVar37,auVar39);
          auVar67 = vorps_avx(auVar67,auVar39);
          auVar60._0_4_ = (int)(auVar69._0_4_ + auVar37._0_4_);
          auVar60._4_4_ = (int)(auVar69._4_4_ + auVar37._4_4_);
          auVar60._8_4_ = (int)(auVar69._8_4_ + auVar37._8_4_);
          auVar60._12_4_ = (int)(auVar69._12_4_ + auVar37._12_4_);
          auVar47._0_4_ = (int)(auVar67._0_4_ + auVar68._0_4_);
          auVar47._4_4_ = (int)(auVar67._4_4_ + auVar68._4_4_);
          auVar47._8_4_ = (int)(auVar67._8_4_ + auVar68._8_4_);
          auVar47._12_4_ = (int)(auVar67._12_4_ + auVar68._12_4_);
          auVar37 = vpackssdw_avx(auVar60,auVar47);
          auVar37 = vpminsw_avx(auVar37,auVar35);
          auVar37 = vpmaxsw_avx(auVar37,auVar36);
          auVar37 = vpacksswb_avx(auVar37,auVar37);
          auVar58 = ZEXT1664(auVar37);
          *(long *)(*pauVar25 + lVar22) = auVar37._0_8_;
          pfVar20 = pfVar20 + 8;
          lVar22 = lVar22 + 8;
        }
        pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar22);
        for (; iVar28 < max_kk; iVar28 = iVar28 + 1) {
          auVar48._0_4_ = fVar2 * *pfVar20;
          auVar48._4_4_ = fVar3 * pfVar20[1];
          auVar48._8_4_ = fVar10 * pfVar20[2];
          auVar48._12_4_ = fVar6 * pfVar20[3];
          auVar37 = vandps_avx(auVar48,auVar38);
          auVar37 = vorps_avx(auVar37,auVar39);
          auVar49._0_4_ = (int)(auVar48._0_4_ + auVar37._0_4_);
          auVar49._4_4_ = (int)(auVar48._4_4_ + auVar37._4_4_);
          auVar49._8_4_ = (int)(auVar48._8_4_ + auVar37._8_4_);
          auVar49._12_4_ = (int)(auVar48._12_4_ + auVar37._12_4_);
          auVar37 = vpackssdw_avx(auVar49,auVar49);
          auVar37 = vpminsw_avx(auVar37,auVar35);
          auVar37 = vpmaxsw_avx(auVar37,auVar36);
          auVar37 = vpacksswb_avx(auVar37,auVar37);
          auVar58 = ZEXT1664(auVar37);
          *(int *)*pauVar25 = auVar37._0_4_;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + 4);
          pfVar20 = pfVar20 + 4;
        }
      }
      if (iVar15 == 1) {
        for (iVar28 = 0; iVar28 + 1 < max_kk; iVar28 = iVar28 + 2) {
          auVar37 = vpcmpeqd_avx(auVar58._0_16_,auVar58._0_16_);
          auVar67 = vgatherdps(ZEXT816(0) << 0x40,auVar37);
          auVar37 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar37 = vgatherdps(ZEXT816(0) << 0x40,auVar37);
          auVar50._0_4_ = auVar67._0_4_ * fVar2;
          auVar50._4_4_ = auVar67._4_4_ * fVar3;
          auVar50._8_4_ = auVar67._8_4_ * fVar10;
          auVar50._12_4_ = auVar67._12_4_ * fVar6;
          auVar61._0_4_ = auVar37._0_4_ * fVar2;
          auVar61._4_4_ = auVar37._4_4_ * fVar3;
          auVar61._8_4_ = auVar37._8_4_ * fVar10;
          auVar61._12_4_ = auVar37._12_4_ * fVar6;
          auVar69 = vunpcklps_avx(auVar50,auVar61);
          auVar68 = vunpckhps_avx(auVar50,auVar61);
          auVar37 = vandps_avx(auVar69,auVar38);
          auVar67 = vandps_avx(auVar68,auVar38);
          auVar37 = vorps_avx(auVar37,auVar39);
          auVar67 = vorps_avx(auVar67,auVar39);
          auVar62._0_4_ = (int)(auVar69._0_4_ + auVar37._0_4_);
          auVar62._4_4_ = (int)(auVar69._4_4_ + auVar37._4_4_);
          auVar62._8_4_ = (int)(auVar69._8_4_ + auVar37._8_4_);
          auVar62._12_4_ = (int)(auVar69._12_4_ + auVar37._12_4_);
          auVar51._0_4_ = (int)(auVar67._0_4_ + auVar68._0_4_);
          auVar51._4_4_ = (int)(auVar67._4_4_ + auVar68._4_4_);
          auVar51._8_4_ = (int)(auVar67._8_4_ + auVar68._8_4_);
          auVar51._12_4_ = (int)(auVar67._12_4_ + auVar68._12_4_);
          auVar37 = vpackssdw_avx(auVar62,auVar51);
          auVar37 = vpminsw_avx(auVar37,auVar35);
          auVar37 = vpmaxsw_avx(auVar37,auVar36);
          auVar37 = vpacksswb_avx(auVar37,auVar37);
          auVar58 = ZEXT1664(auVar37);
          *(long *)*pauVar25 = auVar37._0_8_;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + 8);
        }
        for (; iVar28 < max_kk; iVar28 = iVar28 + 1) {
          auVar37 = vpcmpeqd_avx(auVar58._0_16_,auVar58._0_16_);
          auVar37 = vgatherdps(ZEXT816(0) << 0x40,auVar37);
          auVar52._0_4_ = auVar37._0_4_ * fVar2;
          auVar52._4_4_ = auVar37._4_4_ * fVar3;
          auVar52._8_4_ = auVar37._8_4_ * fVar10;
          auVar52._12_4_ = auVar37._12_4_ * fVar6;
          auVar37 = vandps_avx(auVar52,auVar38);
          auVar37 = vorps_avx(auVar37,auVar39);
          auVar53._0_4_ = (int)(auVar52._0_4_ + auVar37._0_4_);
          auVar53._4_4_ = (int)(auVar52._4_4_ + auVar37._4_4_);
          auVar53._8_4_ = (int)(auVar52._8_4_ + auVar37._8_4_);
          auVar53._12_4_ = (int)(auVar52._12_4_ + auVar37._12_4_);
          auVar37 = vpackssdw_avx(auVar53,auVar53);
          auVar37 = vpminsw_avx(auVar37,auVar35);
          auVar37 = vpmaxsw_avx(auVar37,auVar36);
          auVar37 = vpacksswb_avx(auVar37,auVar37);
          auVar58 = ZEXT1664(auVar37);
          *(int *)*pauVar25 = auVar37._0_4_;
          pauVar25 = (undefined1 (*) [16])(*pauVar25 + 4);
        }
      }
      lVar23 = lVar23 + lVar18;
      lVar27 = lVar27 + lVar18;
      lVar34 = lVar34 + lVar18;
    }
    auVar41._8_4_ = 0x80000000;
    auVar41._0_8_ = 0x8000000080000000;
    auVar41._12_4_ = 0x80000000;
    auVar44._8_4_ = 0x3effffff;
    auVar44._0_8_ = 0x3effffff3effffff;
    auVar44._12_4_ = 0x3effffff;
    for (; (long)(uVar24 | 1) < lVar17; uVar24 = uVar24 + 2) {
      pvVar4 = A->data;
      lVar34 = lVar29 + uVar24;
      fVar2 = *(float *)((long)scales->data + lVar34 * 4);
      auVar54._4_4_ = fVar2;
      auVar54._0_4_ = fVar2;
      auVar54._8_4_ = fVar2;
      auVar54._12_4_ = fVar2;
      fVar3 = *(float *)((long)scales->data + lVar34 * 4 + 4);
      auVar63._4_4_ = fVar3;
      auVar63._0_4_ = fVar3;
      auVar63._8_4_ = fVar3;
      auVar63._12_4_ = fVar3;
      pfVar20 = (float *)((long)pvVar4 + lVar26 * 4 + lVar34 * lVar33 * 4);
      pauVar30 = pauVar25;
      for (lVar34 = 0; (int)lVar34 + 3 < max_kk; lVar34 = lVar34 + 4) {
        auVar64._0_4_ = fVar2 * *pfVar20;
        auVar64._4_4_ = fVar2 * pfVar20[1];
        auVar64._8_4_ = fVar2 * pfVar20[2];
        auVar64._12_4_ = fVar2 * pfVar20[3];
        pfVar1 = (float *)((long)pvVar4 + lVar34 * 4 + lVar27);
        auVar70._0_4_ = fVar3 * *pfVar1;
        auVar70._4_4_ = fVar3 * pfVar1[1];
        auVar70._8_4_ = fVar3 * pfVar1[2];
        auVar70._12_4_ = fVar3 * pfVar1[3];
        auVar68 = vmovlhps_avx(auVar64,auVar70);
        auVar69 = vunpckhpd_avx(auVar64,auVar70);
        auVar37 = vandps_avx(auVar68,auVar38);
        auVar67 = vandps_avx(auVar69,auVar38);
        auVar37 = vorps_avx(auVar37,auVar39);
        auVar67 = vorps_avx(auVar67,auVar39);
        auVar71._0_4_ = (int)(auVar37._0_4_ + auVar68._0_4_);
        auVar71._4_4_ = (int)(auVar37._4_4_ + auVar68._4_4_);
        auVar71._8_4_ = (int)(auVar37._8_4_ + auVar68._8_4_);
        auVar71._12_4_ = (int)(auVar37._12_4_ + auVar68._12_4_);
        auVar65._0_4_ = (int)(auVar67._0_4_ + auVar69._0_4_);
        auVar65._4_4_ = (int)(auVar67._4_4_ + auVar69._4_4_);
        auVar65._8_4_ = (int)(auVar67._8_4_ + auVar69._8_4_);
        auVar65._12_4_ = (int)(auVar67._12_4_ + auVar69._12_4_);
        auVar37 = vpackssdw_avx(auVar71,auVar65);
        auVar37 = vpminsw_avx(auVar37,auVar35);
        auVar37 = vpmaxsw_avx(auVar37,auVar36);
        auVar37 = vpacksswb_avx(auVar37,auVar37);
        *(long *)*pauVar30 = auVar37._0_8_;
        pauVar30 = (undefined1 (*) [16])(*pauVar30 + 8);
        pfVar20 = pfVar20 + 4;
      }
      auVar37 = vmovlhps_avx(auVar54,auVar63);
      for (; (int)lVar34 + 1 < max_kk; lVar34 = lVar34 + 2) {
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)((long)pvVar4 + lVar34 * 4 + lVar27);
        auVar91._8_8_ = 0;
        auVar91._0_8_ = *(ulong *)((long)pvVar4 + lVar34 * 4 + lVar23);
        auVar67 = vmovlhps_avx(auVar91,auVar72);
        auVar73._0_4_ = auVar67._0_4_ * auVar37._0_4_;
        auVar73._4_4_ = auVar67._4_4_ * auVar37._4_4_;
        auVar73._8_4_ = auVar67._8_4_ * auVar37._8_4_;
        auVar73._12_4_ = auVar67._12_4_ * auVar37._12_4_;
        auVar67 = vandps_avx(auVar73,auVar38);
        auVar67 = vorps_avx(auVar67,auVar39);
        auVar74._0_4_ = (int)(auVar73._0_4_ + auVar67._0_4_);
        auVar74._4_4_ = (int)(auVar73._4_4_ + auVar67._4_4_);
        auVar74._8_4_ = (int)(auVar73._8_4_ + auVar67._8_4_);
        auVar74._12_4_ = (int)(auVar73._12_4_ + auVar67._12_4_);
        auVar67 = vpackssdw_avx(auVar74,auVar74);
        auVar67 = vpminsw_avx(auVar67,auVar35);
        auVar67 = vpmaxsw_avx(auVar67,auVar36);
        auVar67 = vpacksswb_avx(auVar67,auVar67);
        *(int *)(*pauVar25 + lVar34 * 2) = auVar67._0_4_;
        pauVar30 = (undefined1 (*) [16])(*pauVar30 + 4);
      }
      for (; pauVar25 = pauVar30, (int)lVar34 < max_kk; lVar34 = lVar34 + 1) {
        fVar10 = fVar2 * *(float *)((long)pvVar4 + lVar34 * 4 + lVar23);
        auVar37 = vandps_avx(ZEXT416((uint)fVar10),auVar41);
        auVar37 = vorps_avx(auVar37,auVar44);
        auVar37 = ZEXT416((uint)(fVar10 + auVar37._0_4_));
        auVar37 = vroundss_avx(auVar37,auVar37,0xb);
        iVar15 = (int)auVar37._0_4_;
        if ((int)auVar37._0_4_ < -0x7e) {
          iVar15 = -0x7f;
        }
        if (0x7e < iVar15) {
          iVar15 = 0x7f;
        }
        (*pauVar25)[0] = (char)iVar15;
        fVar10 = fVar3 * *(float *)((long)pvVar4 + lVar34 * 4 + lVar27);
        auVar37 = vandps_avx(ZEXT416((uint)fVar10),auVar41);
        auVar37 = vorps_avx(auVar37,auVar44);
        auVar37 = ZEXT416((uint)(fVar10 + auVar37._0_4_));
        auVar37 = vroundss_avx(auVar37,auVar37,0xb);
        iVar15 = (int)auVar37._0_4_;
        if ((int)auVar37._0_4_ < -0x7e) {
          iVar15 = -0x7f;
        }
        if (0x7e < iVar15) {
          iVar15 = 0x7f;
        }
        (*pauVar25)[1] = (char)iVar15;
        pauVar30 = (undefined1 (*) [16])(*pauVar25 + 2);
      }
      lVar23 = lVar23 + lVar33 * 8;
      lVar27 = lVar27 + lVar33 * 8;
    }
    auVar42._8_4_ = 0x3effffff;
    auVar42._0_8_ = 0x3effffff3effffff;
    auVar42._12_4_ = 0x3effffff;
    for (; (long)uVar24 < lVar17; uVar24 = uVar24 + 1) {
      pvVar4 = A->data;
      fVar2 = *(float *)((long)scales->data + (lVar29 + uVar24) * 4);
      pfVar20 = (float *)((long)pvVar4 + lVar26 * 4 + (lVar29 + uVar24) * lVar33 * 4);
      for (lVar27 = 0; (int)lVar27 + 3 < max_kk; lVar27 = lVar27 + 4) {
        auVar55._0_4_ = fVar2 * *pfVar20;
        auVar55._4_4_ = fVar2 * pfVar20[1];
        auVar55._8_4_ = fVar2 * pfVar20[2];
        auVar55._12_4_ = fVar2 * pfVar20[3];
        auVar37 = vandps_avx(auVar55,auVar38);
        auVar37 = vorps_avx(auVar37,auVar39);
        auVar56._0_4_ = (int)(auVar55._0_4_ + auVar37._0_4_);
        auVar56._4_4_ = (int)(auVar55._4_4_ + auVar37._4_4_);
        auVar56._8_4_ = (int)(auVar55._8_4_ + auVar37._8_4_);
        auVar56._12_4_ = (int)(auVar55._12_4_ + auVar37._12_4_);
        auVar37 = vpackssdw_avx(auVar56,auVar56);
        auVar37 = vpminsw_avx(auVar37,auVar35);
        auVar37 = vpmaxsw_avx(auVar37,auVar36);
        auVar37 = vpacksswb_avx(auVar37,auVar37);
        *(int *)(*pauVar25 + lVar27) = auVar37._0_4_;
        pfVar20 = pfVar20 + 4;
      }
      for (; (int)lVar27 < max_kk; lVar27 = lVar27 + 1) {
        fVar3 = fVar2 * *(float *)((long)pvVar4 + lVar27 * 4 + lVar23);
        auVar37 = vandps_avx(ZEXT416((uint)fVar3),auVar38);
        auVar37 = vorps_avx(auVar37,auVar42);
        auVar37 = ZEXT416((uint)(fVar3 + auVar37._0_4_));
        auVar37 = vroundss_avx(auVar37,auVar37,0xb);
        iVar15 = (int)auVar37._0_4_;
        if (iVar15 < -0x7e) {
          iVar15 = -0x7f;
        }
        if (0x7e < iVar15) {
          iVar15 = 0x7f;
        }
        (*pauVar25)[lVar27] = (char)iVar15;
      }
      lVar23 = lVar23 + lVar33 * 4;
      pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar27);
    }
  }
  else {
    pack_A_tile_fp32_to_int8_avxvnni(A,AT,i,max_ii,k,max_kk,scales);
  }
  return;
}

Assistant:

void pack_A_tile_fp32_to_int8_avx2(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk, const Mat& scales)
{
    pack_A_tile_fp32_to_int8(A, AT, i, max_ii, k, max_kk, scales);
}